

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_special(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  ushort uVar1;
  TCGContext_conflict6 *tcg_ctx_00;
  int16_t imm;
  uint uVar2;
  uint rs_00;
  uint rt_00;
  uint uVar3;
  uint32_t stype;
  TCGv_i32 arg2;
  TCGv_i32 helper_tmp;
  uint32_t op1;
  int sa;
  int rd;
  int rt;
  int rs;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x15 & 0x1f;
  uVar1 = *(ushort *)((long)&ctx->opcode + 2);
  rs_00 = uVar1 & 0x1f;
  rt_00 = ctx->opcode >> 0xb & 0x1f;
  uVar3 = ctx->opcode >> 6 & 0x1f;
  helper_tmp._4_4_ = ctx->opcode & 0xfc00003f;
  imm = (int16_t)uVar3;
  switch(helper_tmp._4_4_) {
  case 0:
    if ((((uVar3 == 5) && (rt_00 == 0)) && (uVar2 == 0)) &&
       ((((uVar1 & 0x1f) == 0 && ((ctx->insn_flags & 0x2000) != 0)) &&
        ((ctx->hflags & 0x87f800) != 0)))) {
      generate_exception_end(ctx,0x14);
      return;
    }
  case 3:
    gen_shift_imm(ctx,helper_tmp._4_4_,rt_00,rs_00,imm);
    break;
  default:
    if ((ctx->insn_flags & 0x2000) == 0) {
      if ((ctx->insn_flags & 0x8000000000000) == 0) {
        decode_opc_special_legacy(env,ctx);
      }
      else {
        decode_opc_special_tx79(env,ctx);
      }
    }
    else {
      decode_opc_special_r6(env,ctx);
    }
    break;
  case 2:
    uVar2 = ctx->opcode >> 0x15 & 0x1f;
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        generate_exception_end(ctx,0x14);
        return;
      }
      if ((ctx->insn_flags & 0x40) != 0) {
        helper_tmp._4_4_ = 0x200002;
      }
    }
    gen_shift_imm(ctx,helper_tmp._4_4_,rt_00,rs_00,imm);
    break;
  case 4:
  case 7:
    gen_shift(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 5:
    if (((ctx->insn_flags & 0x2000) == 0) && ((env->CP0_Config3 & 0x10000000U) == 0)) {
      arg2 = tcg_const_i32_mips64el(tcg_ctx_00,uVar3);
      gen_helper_pmon(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
    }
    else {
      decode_opc_special_r6(env,ctx);
    }
    break;
  case 6:
    uVar3 = ctx->opcode >> 6 & 0x1f;
    if (uVar3 != 0) {
      if (uVar3 != 1) {
        generate_exception_end(ctx,0x14);
        return;
      }
      if ((ctx->insn_flags & 0x40) != 0) {
        helper_tmp._4_4_ = 0x46;
      }
    }
    gen_shift(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 9:
    gen_compute_branch(ctx,helper_tmp._4_4_,4,uVar2,rt_00,uVar3,4);
    break;
  case 0xc:
    generate_exception_end(ctx,0x11);
    break;
  case 0xd:
    generate_exception_end(ctx,0x12);
    break;
  case 0xf:
    check_insn(ctx,2);
    stype = extract32(ctx->opcode,6,5);
    gen_sync(tcg_ctx_00,stype);
    break;
  case 0x14:
  case 0x17:
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_shift(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x15:
    if (((ctx->insn_flags & 0x2000) != 0) || ((env->CP0_Config3 & 0x10000000U) != 0)) {
      decode_opc_special_r6(env,ctx);
    }
    break;
  case 0x16:
    uVar3 = ctx->opcode >> 6 & 0x1f;
    if (uVar3 != 0) {
      if (uVar3 != 1) {
        generate_exception_end(ctx,0x14);
        return;
      }
      if ((ctx->insn_flags & 0x40) != 0) {
        helper_tmp._4_4_ = 0x56;
      }
    }
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_shift(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
    gen_arith(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    gen_logic(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x2a:
  case 0x2b:
    gen_slt(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_arith(ctx,helper_tmp._4_4_,rt_00,uVar2,rs_00);
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x36:
    check_insn(ctx,2);
    gen_trap(ctx,helper_tmp._4_4_,uVar2,rs_00,-1);
    break;
  case 0x38:
  case 0x3b:
  case 0x3c:
  case 0x3f:
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_shift_imm(ctx,helper_tmp._4_4_,rt_00,rs_00,imm);
    break;
  case 0x3a:
    uVar2 = ctx->opcode >> 0x15 & 0x1f;
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        generate_exception_end(ctx,0x14);
        return;
      }
      if ((ctx->insn_flags & 0x40) != 0) {
        helper_tmp._4_4_ = 0x20003a;
      }
    }
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_shift_imm(ctx,helper_tmp._4_4_,rt_00,rs_00,imm);
    break;
  case 0x3e:
    uVar2 = ctx->opcode >> 0x15 & 0x1f;
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        generate_exception_end(ctx,0x14);
        return;
      }
      if ((ctx->insn_flags & 0x40) != 0) {
        helper_tmp._4_4_ = 0x20003e;
      }
    }
    check_insn(ctx,4);
    check_mips_64(ctx);
    gen_shift_imm(ctx,helper_tmp._4_4_,rt_00,rs_00,imm);
  }
  return;
}

Assistant:

static void decode_opc_special(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;

    op1 = MASK_SPECIAL(ctx->opcode);
    switch (op1) {
    case OPC_SLL:          /* Shift with immediate */
        if (sa == 5 && rd == 0 &&
            rs == 0 && rt == 0) { /* PAUSE */
            if ((ctx->insn_flags & ISA_MIPS32R6) &&
                (ctx->hflags & MIPS_HFLAG_BMASK)) {
                generate_exception_end(ctx, EXCP_RI);
                break;
            }
        }
        /* Fallthrough */
    case OPC_SRA:
        gen_shift_imm(ctx, op1, rd, rt, sa);
        break;
    case OPC_SRL:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* rotr is decoded as srl on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_ROTR;
            }
            /* Fallthrough */
        case 0:
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_ADD:
    case OPC_ADDU:
    case OPC_SUB:
    case OPC_SUBU:
        gen_arith(ctx, op1, rd, rs, rt);
        break;
    case OPC_SLLV:         /* Shifts */
    case OPC_SRAV:
        gen_shift(ctx, op1, rd, rs, rt);
        break;
    case OPC_SRLV:
        switch ((ctx->opcode >> 6) & 0x1f) {
        case 1:
            /* rotrv is decoded as srlv on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_ROTRV;
            }
            /* Fallthrough */
        case 0:
            gen_shift(ctx, op1, rd, rs, rt);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_SLT:          /* Set on less than */
    case OPC_SLTU:
        gen_slt(ctx, op1, rd, rs, rt);
        break;
    case OPC_AND:          /* Logic*/
    case OPC_OR:
    case OPC_NOR:
    case OPC_XOR:
        gen_logic(ctx, op1, rd, rs, rt);
        break;
    case OPC_JALR:
        gen_compute_branch(ctx, op1, 4, rs, rd, sa, 4);
        break;
    case OPC_TGE: /* Traps */
    case OPC_TGEU:
    case OPC_TLT:
    case OPC_TLTU:
    case OPC_TEQ:
    case OPC_TNE:
        check_insn(ctx, ISA_MIPS2);
        gen_trap(ctx, op1, rs, rt, -1);
        break;
    case OPC_LSA: /* OPC_PMON */
        if ((ctx->insn_flags & ISA_MIPS32R6) ||
            (env->CP0_Config3 & (1 << CP0C3_MSAP))) {
            decode_opc_special_r6(env, ctx);
        } else {
            /* Pmon entry point, also R4010 selsl */
#ifdef MIPS_STRICT_STANDARD
            MIPS_INVAL("PMON / selsl");
            generate_exception_end(ctx, EXCP_RI);
#else
            gen_helper_0e0i(pmon, sa);
#endif
        }
        break;
    case OPC_SYSCALL:
        generate_exception_end(ctx, EXCP_SYSCALL);
        break;
    case OPC_BREAK:
        generate_exception_end(ctx, EXCP_BREAK);
        break;
    case OPC_SYNC:
        check_insn(ctx, ISA_MIPS2);
        gen_sync(tcg_ctx, extract32(ctx->opcode, 6, 5));
        break;

#if defined(TARGET_MIPS64)
        /* MIPS64 specific opcodes */
    case OPC_DSLL:
    case OPC_DSRA:
    case OPC_DSLL32:
    case OPC_DSRA32:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_shift_imm(ctx, op1, rd, rt, sa);
        break;
    case OPC_DSRL:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* drotr is decoded as dsrl on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTR;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DSRL32:
        switch ((ctx->opcode >> 21) & 0x1f) {
        case 1:
            /* drotr32 is decoded as dsrl32 on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTR32;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift_imm(ctx, op1, rd, rt, sa);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DADD:
    case OPC_DADDU:
    case OPC_DSUB:
    case OPC_DSUBU:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_arith(ctx, op1, rd, rs, rt);
        break;
    case OPC_DSLLV:
    case OPC_DSRAV:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        gen_shift(ctx, op1, rd, rs, rt);
        break;
    case OPC_DSRLV:
        switch ((ctx->opcode >> 6) & 0x1f) {
        case 1:
            /* drotrv is decoded as dsrlv on non-R2 CPUs */
            if (ctx->insn_flags & ISA_MIPS32R2) {
                op1 = OPC_DROTRV;
            }
            /* Fallthrough */
        case 0:
            check_insn(ctx, ISA_MIPS3);
            check_mips_64(ctx);
            gen_shift(ctx, op1, rd, rs, rt);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case OPC_DLSA:
        if ((ctx->insn_flags & ISA_MIPS32R6) ||
            (env->CP0_Config3 & (1 << CP0C3_MSAP))) {
            decode_opc_special_r6(env, ctx);
        }
        break;
#endif
    default:
        if (ctx->insn_flags & ISA_MIPS32R6) {
            decode_opc_special_r6(env, ctx);
        } else if (ctx->insn_flags & INSN_R5900) {
            decode_opc_special_tx79(env, ctx);
        } else {
            decode_opc_special_legacy(env, ctx);
        }
    }
}